

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalTopN,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,unsigned_long,duckdb::shared_ptr<duckdb::DynamicFilterData,true>,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,
          vector<duckdb::BoundOrderByNode,_true> *args_1,unsigned_long *args_2,unsigned_long *args_3
          ,shared_ptr<duckdb::DynamicFilterData,_true> *args_4,unsigned_long *args_5)

{
  idx_t limit;
  idx_t offset;
  PhysicalTopN *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  shared_ptr<duckdb::DynamicFilterData,_true> local_68;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_58;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = (PhysicalTopN *)ArenaAllocator::AllocateAligned(&this->arena,0xb8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  limit = *args_2;
  offset = *args_3;
  local_68.internal.super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (args_4->internal).
         super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.internal.super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args_4->internal).super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (args_4->internal).super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args_4->internal).super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  PhysicalTopN::PhysicalTopN
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_80,
             (vector<duckdb::BoundOrderByNode,_true> *)&local_58,limit,offset,&local_68,*args_5);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.internal.
              super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  local_38._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_38);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}